

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char16_t *
fmt::v8::detail::
parse_precision<char16_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char16_t>>&>
          (char16_t *begin,char16_t *end,
          specs_checker<fmt::v8::detail::specs_handler<char16_t>_> *handler)

{
  char16_t cVar1;
  char16_t *pcVar2;
  char16_t local_62;
  precision_adapter local_60;
  int local_58;
  char16_t local_52;
  int precision;
  char16_t c;
  specs_checker<fmt::v8::detail::specs_handler<char16_t>_> *handler_local;
  char16_t *end_local;
  char16_t *begin_local;
  char16_t local_2a;
  precision_adapter *ppStack_28;
  char16_t c_1;
  char16_t *local_20;
  char16_t *local_18;
  char16_t *local_10;
  
  end_local = begin + 1;
  if (end_local == end) {
    local_62 = L'\0';
  }
  else {
    local_62 = *end_local;
  }
  local_52 = local_62;
  _precision = handler;
  handler_local = (specs_checker<fmt::v8::detail::specs_handler<char16_t>_> *)end;
  if (((ushort)local_62 < 0x30) || (0x39 < (ushort)local_62)) {
    if (local_62 != L'{') {
      specs_handler<char16_t>::on_error
                (&handler->super_specs_handler<char16_t>,"missing precision specifier");
      return end_local;
    }
    end_local = begin + 2;
    if (end_local != end) {
      ppStack_28 = &local_60;
      local_2a = *end_local;
      local_60.handler = handler;
      local_20 = end;
      local_18 = end_local;
      if ((local_2a == L'}') || (local_2a == L':')) {
        parse_precision<char16_t,_fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char16_t>_>_&>
        ::precision_adapter::operator()(ppStack_28);
        local_10 = local_18;
      }
      else {
        local_10 = do_parse_arg_id<char16_t,fmt::v8::detail::parse_precision<char16_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char16_t>>&>(char16_t_const*,char16_t_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char16_t>>&)::precision_adapter&>
                             (end_local,end,ppStack_28);
      }
      end_local = local_10;
    }
    if (((specs_checker<fmt::v8::detail::specs_handler<char16_t>_> *)end_local == handler_local) ||
       (pcVar2 = end_local + 1, cVar1 = *end_local, end_local = pcVar2, cVar1 != L'}')) {
      specs_handler<char16_t>::on_error
                (&_precision->super_specs_handler<char16_t>,"invalid format string");
      return end_local;
    }
  }
  else {
    local_58 = parse_nonnegative_int<char16_t>(&end_local,end,-1);
    if (local_58 == -1) {
      specs_handler<char16_t>::on_error
                (&_precision->super_specs_handler<char16_t>,"number is too big");
    }
    else {
      specs_setter<char16_t>::on_precision((specs_setter<char16_t> *)_precision,local_58);
    }
  }
  specs_checker<fmt::v8::detail::specs_handler<char16_t>_>::end_precision(_precision);
  return end_local;
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}